

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall
QAccessibleDialogButtonBox::QAccessibleDialogButtonBox
          (QAccessibleDialogButtonBox *this,QWidget *widget)

{
  long lVar1;
  undefined8 in_RSI;
  Role role;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  
  role = (Role)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w = in_RDI;
  QString::QString((QString *)0x7e4d82);
  QAccessibleWidget::QAccessibleWidget(in_stack_ffffffffffffffe0,w,role,(QString *)in_RDI);
  QString::~QString((QString *)0x7e4da4);
  *(undefined ***)in_RDI = &PTR__QAccessibleDialogButtonBox_00d293a8;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QAccessibleDialogButtonBox_00d29478;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleDialogButtonBox::QAccessibleDialogButtonBox(QWidget *widget)
    : QAccessibleWidget(widget, QAccessible::Grouping)
{
    Q_ASSERT(qobject_cast<QDialogButtonBox*>(widget));
}